

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<std::pair<QString,_QString>,_QString> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::insert
          (Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *this,size_t i)

{
  long lVar1;
  byte bVar2;
  
  bVar2 = this->nextFree;
  if (bVar2 == this->allocated) {
    addStorage(this);
    bVar2 = this->nextFree;
  }
  lVar1 = (ulong)((uint)bVar2 * 8) * 9;
  this->nextFree = (this->entries->storage).data[lVar1];
  this->offsets[i] = bVar2;
  return (Node<std::pair<QString,_QString>,_QString> *)((this->entries->storage).data + lVar1);
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }